

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

Color ftxui::anon_unknown_0::ComputeColorSupport(void)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string TERM;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string COLORTERM;
  
  pcVar2 = getenv("COLORTERM");
  pcVar2 = Safe(pcVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,pcVar2,&local_31);
  std::allocator<char>::~allocator(&local_31);
  bVar1 = Contains((string *)local_30,"24bit");
  if (!bVar1) {
    bVar1 = Contains((string *)local_30,"truecolor");
    if (!bVar1) {
      pcVar2 = getenv("TERM");
      pcVar2 = Safe(pcVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_68,pcVar2,&local_69);
      std::allocator<char>::~allocator(&local_69);
      bVar1 = Contains((string *)local_30,"256");
      if (bVar1) {
LAB_0011b8dd:
        COLORTERM.field_2._12_4_ = 2;
      }
      else {
        bVar1 = Contains((string *)local_68,"256");
        if (bVar1) goto LAB_0011b8dd;
        COLORTERM.field_2._12_4_ = 1;
      }
      TERM.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_68);
      goto LAB_0011b932;
    }
  }
  COLORTERM.field_2._12_4_ = 3;
  TERM.field_2._8_4_ = 1;
LAB_0011b932:
  std::__cxx11::string::~string((string *)local_30);
  return COLORTERM.field_2._12_4_;
}

Assistant:

Terminal::Color ComputeColorSupport() {
#if defined(__EMSCRIPTEN__)
  return Terminal::Color::TrueColor;
#endif

  std::string COLORTERM = Safe(std::getenv("COLORTERM"));  // NOLINT
  if (Contains(COLORTERM, "24bit") || Contains(COLORTERM, "truecolor")) {
    return Terminal::Color::TrueColor;
  }

  std::string TERM = Safe(std::getenv("TERM"));  // NOLINT
  if (Contains(COLORTERM, "256") || Contains(TERM, "256")) {
    return Terminal::Color::Palette256;
  }

#if defined(FTXUI_MICROSOFT_TERMINAL_FALLBACK)
  // Microsoft terminals do not properly declare themselve supporting true
  // colors: https://github.com/microsoft/terminal/issues/1040
  // As a fallback, assume microsoft terminal are the ones not setting those
  // variables, and enable true colors.
  if (TERM.empty() && COLORTERM.empty()) {
    return Terminal::Color::TrueColor;
  }
#endif

  return Terminal::Color::Palette16;
}